

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

int __thiscall
duckdb::StrpTimeFormat::NumericSpecifierWidth(StrpTimeFormat *this,StrTimeSpecifier specifier)

{
  StrTimeSpecifier specifier_local;
  StrpTimeFormat *this_local;
  int local_4;
  
  switch(specifier) {
  case WEEKDAY_DECIMAL:
  case WEEKDAY_ISO:
    local_4 = 1;
    break;
  case DAY_OF_MONTH_PADDED:
  case DAY_OF_MONTH:
  case MONTH_DECIMAL_PADDED:
  case MONTH_DECIMAL:
  case YEAR_WITHOUT_CENTURY_PADDED:
  case YEAR_WITHOUT_CENTURY:
  case HOUR_24_PADDED:
  case HOUR_24_DECIMAL:
  case HOUR_12_PADDED:
  case HOUR_12_DECIMAL:
  case MINUTE_PADDED:
  case MINUTE_DECIMAL:
  case SECOND_PADDED:
  case SECOND_DECIMAL:
  case WEEK_NUMBER_PADDED_SUN_FIRST:
  case WEEK_NUMBER_PADDED_MON_FIRST:
  case WEEK_NUMBER_ISO:
    local_4 = 2;
    break;
  default:
    local_4 = -1;
    break;
  case YEAR_DECIMAL:
  case YEAR_ISO:
    local_4 = 4;
    break;
  case MICROSECOND_PADDED:
    local_4 = 6;
    break;
  case MILLISECOND_PADDED:
  case DAY_OF_YEAR_PADDED:
  case DAY_OF_YEAR_DECIMAL:
    local_4 = 3;
    break;
  case NANOSECOND_PADDED:
    local_4 = 9;
  }
  return local_4;
}

Assistant:

int StrpTimeFormat::NumericSpecifierWidth(StrTimeSpecifier specifier) {
	switch (specifier) {
	case StrTimeSpecifier::WEEKDAY_DECIMAL:
	case StrTimeSpecifier::WEEKDAY_ISO:
		return 1;
	case StrTimeSpecifier::DAY_OF_MONTH_PADDED:
	case StrTimeSpecifier::DAY_OF_MONTH:
	case StrTimeSpecifier::MONTH_DECIMAL_PADDED:
	case StrTimeSpecifier::MONTH_DECIMAL:
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED:
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY:
	case StrTimeSpecifier::HOUR_24_PADDED:
	case StrTimeSpecifier::HOUR_24_DECIMAL:
	case StrTimeSpecifier::HOUR_12_PADDED:
	case StrTimeSpecifier::HOUR_12_DECIMAL:
	case StrTimeSpecifier::MINUTE_PADDED:
	case StrTimeSpecifier::MINUTE_DECIMAL:
	case StrTimeSpecifier::SECOND_PADDED:
	case StrTimeSpecifier::SECOND_DECIMAL:
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST:
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST:
	case StrTimeSpecifier::WEEK_NUMBER_ISO:
		return 2;
	case StrTimeSpecifier::MILLISECOND_PADDED:
	case StrTimeSpecifier::DAY_OF_YEAR_PADDED:
	case StrTimeSpecifier::DAY_OF_YEAR_DECIMAL:
		return 3;
	case StrTimeSpecifier::YEAR_DECIMAL:
	case StrTimeSpecifier::YEAR_ISO:
		return 4;
	case StrTimeSpecifier::MICROSECOND_PADDED:
		return 6;
	case StrTimeSpecifier::NANOSECOND_PADDED:
		return 9;
	default:
		return -1;
	}
}